

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

TString * __thiscall CFile::ReadWord(CFile *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  char *__dest;
  CFile *in_RDI;
  uchar *pbuf;
  uchar tempbuf [2048];
  uchar cEnd;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  byte *local_820;
  byte local_818;
  byte abStack_817 [2047];
  byte abStack_18 [7];
  byte local_11;
  TString *local_8;
  
  if (in_RDI->fp == (FILE *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "ReadWord error: Invalid fp.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  bVar1 = End(in_RDI);
  if (bVar1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "ReadWord error: EOF.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  iVar2 = fgetc((FILE *)in_RDI->fp);
  local_11 = (byte)iVar2;
  while (iVar2 = isspace((uint)local_11), iVar2 != 0) {
    iVar2 = fgetc((FILE *)in_RDI->fp);
    local_11 = (byte)iVar2;
  }
  if ((local_11 == 0x27) || (local_11 == 0x22)) {
    local_820 = &local_818;
  }
  else {
    local_818 = local_11;
    local_820 = abStack_817;
    local_11 = 0x20;
  }
  do {
    if (abStack_18 <= local_820) {
      UpdateEOF((CFile *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
      bVar1 = End(in_RDI);
      if (!bVar1) {
        fprintf(_stderr,"Bug: word too long: %s",&local_818);
      }
LAB_004b6b72:
      local_8 = &in_RDI->result;
      return local_8;
    }
    iVar2 = fgetc((FILE *)in_RDI->fp);
    *local_820 = (byte)iVar2;
    if (local_11 == 0x20) {
      uVar3 = isspace((uint)*local_820);
    }
    else {
      uVar3 = (uint)(*local_820 == local_11);
    }
    if (uVar3 != 0) {
      if (local_11 == 0x20) {
        ungetc((uint)*local_820,(FILE *)in_RDI->fp);
      }
      *local_820 = 0;
      __dest = TString::GetBuffer(&in_RDI->result);
      strcpy(__dest,(char *)&local_818);
      UpdateEOF((CFile *)CONCAT44(uVar3,in_stack_fffffffffffff7d0));
      goto LAB_004b6b72;
    }
    local_820 = local_820 + 1;
    in_stack_fffffffffffff7d4 = 0;
  } while( true );
}

Assistant:

ReadWord(void)
{
	if(!fp)
		throw "ReadWord error: Invalid fp.";
	
	if(End())
		throw "ReadWord error: EOF.";
	
	unsigned char cEnd, tempbuf[MAX_WORD_LENGTH], *pbuf;
	for(cEnd = fgetc(fp); isspace(cEnd); cEnd = fgetc(fp))
		;
	if(cEnd == '\'' || cEnd == '"')
		pbuf = &tempbuf[0];
	else
	{
		tempbuf[0] = cEnd;
		pbuf = &tempbuf[0] + 1;
		cEnd = ' ';
	}

	for(; pbuf < tempbuf + MAX_WORD_LENGTH; pbuf++)
	{
		*pbuf = fgetc(fp);

		if(cEnd == ' ' ? isspace(*pbuf) : *pbuf == cEnd) 	//if the endchar is a  ' ' we're looking for whitespace
		{													//otherwise just a match to cEnd
			if(cEnd == ' ')
				ungetc(*pbuf, fp);							//back up!

			*pbuf = '\0';
			strcpy(result.GetBuffer(), (const char *)&tempbuf[0]);
			UpdateEOF();
			return result;
		}
	}
	UpdateEOF();
	if(!End())
		fprintf(stderr, "Bug: word too long: %s", tempbuf);
	return result;
}